

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NDOLoader.cpp
# Opt level: O0

void __thiscall
Assimp::NDOImporter::InternReadFile
          (NDOImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer *ppuVar1;
  uint uVar2;
  char *pcVar3;
  byte bVar4;
  int8_t iVar5;
  uint8_t uVar6;
  bool bVar7;
  uint16_t uVar8;
  int iVar9;
  IOStream *stream;
  DeadlyImportError *this_00;
  Logger *pLVar10;
  basic_formatter *this_01;
  size_type sVar11;
  vector<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_> *this_02;
  aiNode *paVar12;
  aiMesh **__s;
  reference name;
  reference pEVar13;
  mapped_type_conflict2 *pmVar14;
  aiMesh *this_03;
  size_type sVar15;
  ulong *puVar16;
  const_reference pvVar17;
  const_reference pvVar18;
  void *pvVar19;
  iterator __first;
  iterator __last;
  aiVector3D *paVar20;
  iterator __first_00;
  iterator __last_00;
  uint *puVar21;
  ulong uVar22;
  float fVar23;
  aiVector3t<float> *local_6b8;
  aiFace *local_670;
  uint32_t local_5e4;
  uint32_t local_5d8;
  uint32_t local_5c0;
  uint local_5a0;
  uint32_t local_594;
  uint local_588;
  uint local_57c;
  uint32_t local_574;
  uint local_568;
  uint32_t local_53c;
  value_type_conflict3 local_48c;
  uint local_488;
  uint local_484;
  uint next_vert;
  uint next_edge;
  uint cur_edge;
  uint key;
  aiFace *f;
  value_type *v_1;
  iterator __end2_1;
  iterator __begin2_1;
  FaceTable *__range2_1;
  aiFace *faces;
  aiMesh *mesh;
  Edge *edge_1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_> *__range2;
  undefined1 local_418 [4];
  uint n;
  FaceTable face_table;
  aiNode *nd;
  Object *obj_1;
  iterator __end1;
  iterator __begin1;
  vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_> *__range1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vertices;
  aiNode **cc;
  string local_380;
  aiNode *local_360;
  aiNode *root;
  uint local_350;
  uint repeat;
  uint y;
  uint x;
  uint e_4;
  uint e_3;
  Vertex *v;
  undefined8 uStack_330;
  uint local_31c;
  reference pvStack_318;
  uint e_2;
  Face *face;
  uint local_308;
  uint e_1;
  uint i_1;
  uint i;
  Edge *edge;
  uint auStack_2f0 [7];
  uint8_t auStack_2d4 [8];
  uint local_2c0;
  allocator local_2b9;
  uint e;
  reference local_298;
  Object *obj;
  uint o;
  vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_> objects;
  char *pcStack_268;
  uint temp;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string local_e8;
  uint local_c8;
  undefined1 local_c2;
  allocator local_c1;
  uint file_format;
  char *local_a0;
  char *head;
  allocator local_81;
  string local_80;
  undefined1 local_60 [8];
  StreamReaderBE reader;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  NDOImporter *this_local;
  
  reader._48_8_ = pIOHandler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"rb",&local_81);
  stream = IOSystem::Open(pIOHandler,pFile,&local_80);
  StreamReader<true,_false>::StreamReader((StreamReader<true,_false> *)local_60,stream,false);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  local_a0 = StreamReader<true,_false>::GetPtr((StreamReader<true,_false> *)local_60);
  StreamReader<true,_false>::IncPtr((StreamReader<true,_false> *)local_60,9);
  iVar9 = strncmp("nendo ",local_a0,6);
  if (iVar9 == 0) {
    local_c8 = 0xc;
    iVar9 = strncmp("1.0",local_a0 + 6,3);
    if (iVar9 == 0) {
      local_c8 = 10;
      pLVar10 = DefaultLogger::get();
      Logger::info(pLVar10,"NDO file format is 1.0");
    }
    else {
      iVar9 = strncmp("1.1",local_a0 + 6,3);
      if (iVar9 == 0) {
        local_c8 = 0xb;
        pLVar10 = DefaultLogger::get();
        Logger::info(pLVar10,"NDO file format is 1.1");
      }
      else {
        iVar9 = strncmp("1.2",local_a0 + 6,3);
        if (iVar9 == 0) {
          local_c8 = 0xc;
          pLVar10 = DefaultLogger::get();
          Logger::info(pLVar10,"NDO file format is 1.2");
        }
        else {
          pLVar10 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[65]>
                    (&local_260,
                     (char (*) [65])
                     "Unrecognized nendo file format version, continuing happily ... :");
          pcStack_268 = local_a0 + 6;
          this_01 = (basic_formatter *)
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                              &local_260,&stack0xfffffffffffffd98);
          Formatter::basic_formatter::operator_cast_to_string(&local_e8,this_01);
          Logger::warn(pLVar10,&local_e8);
          std::__cxx11::string::~string((string *)&local_e8);
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          ~basic_formatter(&local_260);
        }
      }
    }
    StreamReader<true,_false>::IncPtr((StreamReader<true,_false> *)local_60,2);
    if (0xb < local_c8) {
      StreamReader<true,_false>::IncPtr((StreamReader<true,_false> *)local_60,2);
    }
    bVar4 = StreamReader<true,_false>::GetU1((StreamReader<true,_false> *)local_60);
    objects.
    super__Vector_base<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)bVar4;
    uVar22 = (ulong)objects.
                    super__Vector_base<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    std::allocator<Assimp::NDOImporter::Object>::allocator
              ((allocator<Assimp::NDOImporter::Object> *)((long)&obj + 7));
    std::vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>::vector
              ((vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_> *)
               &o,uVar22,(allocator<Assimp::NDOImporter::Object> *)((long)&obj + 7));
    std::allocator<Assimp::NDOImporter::Object>::~allocator
              ((allocator<Assimp::NDOImporter::Object> *)((long)&obj + 7));
    for (obj._0_4_ = 0; uVar22 = (ulong)(uint)obj,
        sVar11 = std::
                 vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>::
                 size((vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
                       *)&o), uVar22 < sVar11; obj._0_4_ = (uint)obj + 1) {
      iVar5 = StreamReader<true,_false>::GetI1((StreamReader<true,_false> *)local_60);
      if (iVar5 != '\0') {
        local_298 = std::
                    vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
                    ::operator[]((vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
                                  *)&o,(ulong)(uint)obj);
        if (local_c8 < 0xc) {
          uVar8 = StreamReader<true,_false>::GetU2((StreamReader<true,_false> *)local_60);
          local_53c = (uint32_t)uVar8;
        }
        else {
          local_53c = StreamReader<true,_false>::GetU4((StreamReader<true,_false> *)local_60);
        }
        objects.
        super__Vector_base<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_53c;
        local_a0 = StreamReader<true,_false>::GetPtr((StreamReader<true,_false> *)local_60);
        StreamReader<true,_false>::IncPtr
                  ((StreamReader<true,_false> *)local_60,
                   (ulong)(objects.
                           super__Vector_base<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 0x4c));
        pcVar3 = local_a0;
        uVar22 = (ulong)objects.
                        super__Vector_base<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&e,pcVar3,uVar22,&local_2b9);
        std::__cxx11::string::operator=((string *)local_298,(string *)&e);
        std::__cxx11::string::~string((string *)&e);
        std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
        if (local_c8 < 0xc) {
          uVar8 = StreamReader<true,_false>::GetU2((StreamReader<true,_false> *)local_60);
          local_568 = (uint)uVar8;
        }
        else {
          local_568 = StreamReader<true,_false>::GetU4((StreamReader<true,_false> *)local_60);
        }
        objects.
        super__Vector_base<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_568;
        std::vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>::reserve
                  (&local_298->edges,(ulong)local_568);
        for (local_2c0 = 0;
            local_2c0 <
            objects.
            super__Vector_base<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_2c0 = local_2c0 + 1) {
          auStack_2f0[6] = 0;
          auStack_2d4[0] = '\0';
          auStack_2d4[1] = '\0';
          auStack_2d4[2] = '\0';
          auStack_2d4[3] = '\0';
          auStack_2d4[4] = '\0';
          auStack_2d4[5] = '\0';
          auStack_2d4[6] = '\0';
          auStack_2d4[7] = '\0';
          auStack_2f0[2] = 0;
          auStack_2f0[3] = 0;
          auStack_2f0[4] = 0;
          auStack_2f0[5] = 0;
          edge = (Edge *)0x0;
          auStack_2f0[0] = 0;
          auStack_2f0[1] = 0;
          std::vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>::
          push_back(&local_298->edges,(value_type *)&edge);
          _i_1 = std::vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                 ::back(&local_298->edges);
          for (e_1 = 0; e_1 < 8; e_1 = e_1 + 1) {
            if (local_c8 < 0xc) {
              uVar8 = StreamReader<true,_false>::GetU2((StreamReader<true,_false> *)local_60);
              local_574 = (uint32_t)uVar8;
            }
            else {
              local_574 = StreamReader<true,_false>::GetU4((StreamReader<true,_false> *)local_60);
            }
            _i_1->edge[e_1] = local_574;
          }
          if (local_c8 < 0xb) {
            local_57c = 0;
          }
          else {
            bVar4 = StreamReader<true,_false>::GetU1((StreamReader<true,_false> *)local_60);
            local_57c = (uint)bVar4;
          }
          _i_1->hard = local_57c;
          for (local_308 = 0; local_308 < 8; local_308 = local_308 + 1) {
            uVar6 = StreamReader<true,_false>::GetU1((StreamReader<true,_false> *)local_60);
            _i_1->color[local_308] = uVar6;
          }
        }
        if (local_c8 < 0xc) {
          uVar8 = StreamReader<true,_false>::GetU2((StreamReader<true,_false> *)local_60);
          local_588 = (uint)uVar8;
        }
        else {
          local_588 = StreamReader<true,_false>::GetU4((StreamReader<true,_false> *)local_60);
        }
        objects.
        super__Vector_base<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_588;
        std::vector<Assimp::NDOImporter::Face,_std::allocator<Assimp::NDOImporter::Face>_>::reserve
                  (&local_298->faces,(ulong)local_588);
        for (face._4_4_ = 0;
            face._4_4_ <
            objects.
            super__Vector_base<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; face._4_4_ = face._4_4_ + 1) {
          face._0_4_ = 0;
          std::vector<Assimp::NDOImporter::Face,_std::allocator<Assimp::NDOImporter::Face>_>::
          push_back(&local_298->faces,(value_type *)&face);
          pvStack_318 = std::
                        vector<Assimp::NDOImporter::Face,_std::allocator<Assimp::NDOImporter::Face>_>
                        ::back(&local_298->faces);
          if (local_c8 < 0xc) {
            uVar8 = StreamReader<true,_false>::GetU2((StreamReader<true,_false> *)local_60);
            local_594 = (uint32_t)uVar8;
          }
          else {
            local_594 = StreamReader<true,_false>::GetU4((StreamReader<true,_false> *)local_60);
          }
          pvStack_318->elem = local_594;
        }
        if (local_c8 < 0xc) {
          uVar8 = StreamReader<true,_false>::GetU2((StreamReader<true,_false> *)local_60);
          local_5a0 = (uint)uVar8;
        }
        else {
          local_5a0 = StreamReader<true,_false>::GetU4((StreamReader<true,_false> *)local_60);
        }
        objects.
        super__Vector_base<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_5a0;
        std::vector<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>::
        reserve(&local_298->vertices,(ulong)local_5a0);
        for (local_31c = 0;
            local_31c <
            objects.
            super__Vector_base<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_31c = local_31c + 1) {
          this_02 = &local_298->vertices;
          v = (Vertex *)0x0;
          uStack_330._0_4_ = 0.0;
          uStack_330._4_4_ = 0.0;
          Vertex::Vertex((Vertex *)&v);
          std::vector<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>::
          push_back(this_02,(Vertex *)&v);
          _e_4 = std::
                 vector<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>::
                 back(&local_298->vertices);
          if (local_c8 < 0xc) {
            uVar8 = StreamReader<true,_false>::GetU2((StreamReader<true,_false> *)local_60);
            local_5c0 = (uint32_t)uVar8;
          }
          else {
            local_5c0 = StreamReader<true,_false>::GetU4((StreamReader<true,_false> *)local_60);
          }
          _e_4->num = local_5c0;
          fVar23 = StreamReader<true,_false>::GetF4((StreamReader<true,_false> *)local_60);
          (_e_4->val).x = fVar23;
          fVar23 = StreamReader<true,_false>::GetF4((StreamReader<true,_false> *)local_60);
          (_e_4->val).y = fVar23;
          fVar23 = StreamReader<true,_false>::GetF4((StreamReader<true,_false> *)local_60);
          (_e_4->val).z = fVar23;
        }
        if (local_c8 < 0xc) {
          uVar8 = StreamReader<true,_false>::GetU2((StreamReader<true,_false> *)local_60);
          local_5d8 = (uint32_t)uVar8;
        }
        else {
          local_5d8 = StreamReader<true,_false>::GetU4((StreamReader<true,_false> *)local_60);
        }
        objects.
        super__Vector_base<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_5d8;
        for (x = 0; x < objects.
                        super__Vector_base<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; x = x + 1) {
          if (local_c8 < 0xc) {
            StreamReader<true,_false>::GetU2((StreamReader<true,_false> *)local_60);
          }
          else {
            StreamReader<true,_false>::GetU4((StreamReader<true,_false> *)local_60);
          }
        }
        if (local_c8 < 0xc) {
          uVar8 = StreamReader<true,_false>::GetU2((StreamReader<true,_false> *)local_60);
          local_5e4 = (uint32_t)uVar8;
        }
        else {
          local_5e4 = StreamReader<true,_false>::GetU4((StreamReader<true,_false> *)local_60);
        }
        objects.
        super__Vector_base<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_5e4;
        for (y = 0; y < objects.
                        super__Vector_base<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; y = y + 1) {
          if (local_c8 < 0xc) {
            StreamReader<true,_false>::GetU2((StreamReader<true,_false> *)local_60);
          }
          else {
            StreamReader<true,_false>::GetU4((StreamReader<true,_false> *)local_60);
          }
        }
        uVar6 = StreamReader<true,_false>::GetU1((StreamReader<true,_false> *)local_60);
        if (uVar6 != '\0') {
          uVar8 = StreamReader<true,_false>::GetU2((StreamReader<true,_false> *)local_60);
          repeat = (uint)uVar8;
          uVar8 = StreamReader<true,_false>::GetU2((StreamReader<true,_false> *)local_60);
          local_350 = (uint)uVar8;
          for (objects.
               super__Vector_base<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
              objects.
              super__Vector_base<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < repeat * local_350;
              objects.
              super__Vector_base<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                   root._4_4_ +
                   objects.
                   super__Vector_base<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
            bVar4 = StreamReader<true,_false>::GetU1((StreamReader<true,_false> *)local_60);
            root._4_4_ = (uint)bVar4;
            StreamReader<true,_false>::GetU1((StreamReader<true,_false> *)local_60);
            StreamReader<true,_false>::GetU1((StreamReader<true,_false> *)local_60);
            StreamReader<true,_false>::GetU1((StreamReader<true,_false> *)local_60);
          }
        }
      }
    }
    paVar12 = (aiNode *)operator_new(0x478);
    cc._6_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_380,"$NDODummyRoot",(allocator *)((long)&cc + 7));
    aiNode::aiNode(paVar12,&local_380);
    cc._6_1_ = 0;
    pScene->mRootNode = paVar12;
    std::__cxx11::string::~string((string *)&local_380);
    std::allocator<char>::~allocator((allocator<char> *)((long)&cc + 7));
    local_360 = paVar12;
    sVar11 = std::vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
             ::size((vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
                     *)&o);
    local_360->mNumChildren = (uint)sVar11;
    uVar22 = (sVar11 & 0xffffffff) << 3;
    vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)operator_new__(uVar22);
    memset(vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage,0,uVar22);
    local_360->mChildren =
         (aiNode **)
         vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage;
    uVar22 = (ulong)local_360->mNumChildren << 3;
    __s = (aiMesh **)operator_new__(uVar22);
    memset(__s,0,uVar22);
    pScene->mMeshes = __s;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               &indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
    __end1 = std::vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
             ::begin((vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>
                      *)&o);
    obj_1 = (Object *)
            std::vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>::
            end((vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_> *
                )&o);
    while (bVar7 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<Assimp::NDOImporter::Object_*,_std::vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>_>
                                       *)&obj_1), bVar7) {
      name = __gnu_cxx::
             __normal_iterator<Assimp::NDOImporter::Object_*,_std::vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>_>
             ::operator*(&__end1);
      paVar12 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar12,&name->name);
      *(aiNode **)
       vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = paVar12;
      paVar12->mParent = local_360;
      face_table._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)paVar12;
      std::
      map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::map((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             *)local_418);
      __range2._4_4_ = 0;
      __end2 = std::vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>::
               begin(&name->edges);
      edge_1 = (Edge *)std::
                       vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                       ::end(&name->edges);
      while (bVar7 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_Assimp::NDOImporter::Edge_*,_std::vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>_>
                                         *)&edge_1), bVar7) {
        pEVar13 = __gnu_cxx::
                  __normal_iterator<const_Assimp::NDOImporter::Edge_*,_std::vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>_>
                  ::operator*(&__end2);
        pmVar14 = std::
                  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                *)local_418,pEVar13->edge + 2);
        *pmVar14 = __range2._4_4_;
        pmVar14 = std::
                  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                *)local_418,pEVar13->edge + 3);
        *pmVar14 = __range2._4_4_;
        __range2._4_4_ = __range2._4_4_ + 1;
        __gnu_cxx::
        __normal_iterator<const_Assimp::NDOImporter::Edge_*,_std::vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>_>
        ::operator++(&__end2);
      }
      this_03 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(this_03);
      sVar15 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::size((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                       *)local_418);
      this_03->mNumFaces = (uint)sVar15;
      uVar22 = (ulong)this_03->mNumFaces;
      puVar16 = (ulong *)operator_new__(uVar22 << 4 | 8);
      *puVar16 = uVar22;
      __range2_1 = (FaceTable *)(puVar16 + 1);
      if (uVar22 != 0) {
        local_670 = (aiFace *)__range2_1;
        do {
          aiFace::aiFace(local_670);
          local_670 = local_670 + 1;
        } while (local_670 != (aiFace *)((long)__range2_1 + uVar22 * 0x10));
      }
      this_03->mFaces = (aiFace *)__range2_1;
      ppuVar1 = &indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::clear
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)ppuVar1);
      sVar15 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::size((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                       *)local_418);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)ppuVar1,
                 sVar15 << 2);
      __end2_1 = std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::begin((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                          *)local_418);
      v_1 = (value_type *)
            std::
            map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
            ::end((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)local_418);
      while (bVar7 = std::operator!=(&__end2_1,(_Self *)&v_1), bVar7) {
        f = (aiFace *)
            std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator*
                      (&__end2_1);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
        _cur_edge = __range2_1;
        next_edge = f->mNumIndices;
        next_vert = *(uint *)&f->field_0x4;
        do {
          uVar2 = next_edge;
          pvVar17 = std::
                    vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>::
                    operator[](&name->edges,(ulong)next_vert);
          if (uVar2 == pvVar17->edge[3]) {
            pvVar17 = std::
                      vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                      ::operator[](&name->edges,(ulong)next_vert);
            local_484 = pvVar17->edge[5];
            pvVar17 = std::
                      vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                      ::operator[](&name->edges,(ulong)next_vert);
            local_488 = pvVar17->edge[1];
          }
          else {
            pvVar17 = std::
                      vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                      ::operator[](&name->edges,(ulong)next_vert);
            local_484 = pvVar17->edge[4];
            pvVar17 = std::
                      vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                      ::operator[](&name->edges,(ulong)next_vert);
            local_488 = pvVar17->edge[0];
          }
          sVar11 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                             ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                              &indices.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
          local_48c = (value_type_conflict3)sVar11;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1,&local_48c);
          pvVar18 = std::
                    vector<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>
                    ::operator[](&name->vertices,(ulong)local_488);
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                     &indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,&pvVar18->val);
          next_vert = local_484;
        } while (local_484 != *(uint *)&f->field_0x4);
        sVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
        *(int *)&(_cur_edge->_M_t)._M_impl = (int)sVar11;
        pvVar19 = operator_new__((sVar11 & 0xffffffff) << 2);
        *(void **)&(_cur_edge->_M_t)._M_impl.super__Rb_tree_header._M_header = pvVar19;
        __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
        __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
        std::
        copy<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int*>
                  ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )__first._M_current,
                   (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )__last._M_current,
                   *(uint **)&(_cur_edge->_M_t)._M_impl.super__Rb_tree_header._M_header);
        std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator++(&__end2_1);
        __range2_1 = (FaceTable *)
                     &(__range2_1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      }
      sVar11 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                          &indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      this_03->mNumVertices = (uint)sVar11;
      uVar22 = sVar11 & 0xffffffff;
      paVar20 = (aiVector3D *)operator_new__(uVar22 * 0xc);
      if (uVar22 != 0) {
        local_6b8 = paVar20;
        do {
          aiVector3t<float>::aiVector3t(local_6b8);
          local_6b8 = local_6b8 + 1;
        } while (local_6b8 != paVar20 + uVar22);
      }
      this_03->mVertices = paVar20;
      ppuVar1 = &indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      __first_00 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                             ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                              ppuVar1);
      __last_00 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end
                            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                             ppuVar1);
      std::
      copy<__gnu_cxx::__normal_iterator<aiVector3t<float>*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>,aiVector3t<float>*>
                ((__normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                  )__first_00._M_current,
                 (__normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                  )__last_00._M_current,this_03->mVertices);
      if (this_03->mNumVertices == 0) {
        if (this_03 != (aiMesh *)0x0) {
          aiMesh::~aiMesh(this_03);
          operator_delete(this_03);
        }
      }
      else {
        pScene->mMeshes[pScene->mNumMeshes] = this_03;
        uVar2 = pScene->mNumMeshes;
        pScene->mNumMeshes = uVar2 + 1;
        *(undefined4 *)(face_table._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x460) = 1;
        puVar21 = (uint *)operator_new__(4);
        *(uint **)(face_table._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x468) = puVar21;
        *puVar21 = uVar2;
      }
      std::
      map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::~map((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
              *)local_418);
      __gnu_cxx::
      __normal_iterator<Assimp::NDOImporter::Object_*,_std::vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>_>
      ::operator++(&__end1);
      vertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)&(vertices.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage)->z;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               &indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>::~vector
              ((vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_> *)
               &o);
    StreamReader<true,_false>::~StreamReader((StreamReader<true,_false> *)local_60);
    return;
  }
  local_c2 = 1;
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&file_format,"Not a Nendo file; magic signature missing",&local_c1);
  DeadlyImportError::DeadlyImportError(this_00,(string *)&file_format);
  local_c2 = 0;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void NDOImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    StreamReaderBE reader(pIOHandler->Open( pFile, "rb"));

    // first 9 bytes are nendo file format ("nendo 1.n")
    const char* head = (const char*)reader.GetPtr();
    reader.IncPtr(9);

    if (strncmp("nendo ",head,6)) {
        throw DeadlyImportError("Not a Nendo file; magic signature missing");
    }
    // check if this is a supported version. if not, continue, too -- users,
    // please don't complain if it doesn't work then ...
    unsigned int file_format = 12;
    if (!strncmp("1.0",head+6,3)) {
        file_format = 10;
        ASSIMP_LOG_INFO("NDO file format is 1.0");
    }
    else if (!strncmp("1.1",head+6,3)) {
        file_format = 11;
        ASSIMP_LOG_INFO("NDO file format is 1.1");
    }
    else if (!strncmp("1.2",head+6,3)) {
        file_format = 12;
        ASSIMP_LOG_INFO("NDO file format is 1.2");
    }
    else {
        ASSIMP_LOG_WARN_F( "Unrecognized nendo file format version, continuing happily ... :", (head+6));
    }

    reader.IncPtr(2); /* skip flags */
    if (file_format >= 12) {
        reader.IncPtr(2);
    }
    unsigned int temp = reader.GetU1();

    std::vector<Object> objects(temp); /* buffer to store all the loaded objects in */

    // read all objects
    for (unsigned int o = 0; o < objects.size(); ++o) {

//      if (file_format < 12) {
            if (!reader.GetI1()) {
                continue; /* skip over empty object */
            }
        //  reader.GetI2();
//      }
        Object& obj = objects[o];

        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        head = (const char*)reader.GetPtr();
        reader.IncPtr(temp + 76); /* skip unknown stuff */

        obj.name = std::string(head, temp);

        // read edge table
        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        obj.edges.reserve(temp);
        for (unsigned int e = 0; e < temp; ++e) {

            obj.edges.push_back(Edge());
            Edge& edge = obj.edges.back();

            for (unsigned int i = 0; i< 8; ++i) {
                edge.edge[i] = file_format >= 12 ? reader.GetU4() : reader.GetU2();
            }
            edge.hard =  file_format >= 11 ? reader.GetU1() : 0;
            for (unsigned int i = 0; i< 8; ++i) {
                edge.color[i] = reader.GetU1();
            }
        }

        // read face table
        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        obj.faces.reserve(temp);
        for (unsigned int e = 0; e < temp; ++e) {

            obj.faces.push_back(Face());
            Face& face = obj.faces.back();

            face.elem = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        }

        // read vertex table
        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        obj.vertices.reserve(temp);
        for (unsigned int e = 0; e < temp; ++e) {

            obj.vertices.push_back(Vertex());
            Vertex& v = obj.vertices.back();

            v.num = file_format >= 12 ? reader.GetU4() : reader.GetU2();
            v.val.x = reader.GetF4();
            v.val.y = reader.GetF4();
            v.val.z = reader.GetF4();
        }

        // read UVs
        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        for (unsigned int e = 0; e < temp; ++e) {
             file_format >= 12 ? reader.GetU4() : reader.GetU2();
        }

        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        for (unsigned int e = 0; e < temp; ++e) {
             file_format >= 12 ? reader.GetU4() : reader.GetU2();
        }

        if (reader.GetU1()) {
            const unsigned int x = reader.GetU2(), y = reader.GetU2();
            temp = 0;
            while (temp < x*y)  {
                unsigned int repeat = reader.GetU1();
                reader.GetU1();
                reader.GetU1();
                reader.GetU1();
                temp += repeat;
            }
        }
    }

    // construct a dummy node graph and add all named objects as child nodes
    aiNode* root = pScene->mRootNode = new aiNode("$NDODummyRoot");
    aiNode** cc = root->mChildren = new aiNode* [ root->mNumChildren = static_cast<unsigned int>( objects.size()) ] ();
    pScene->mMeshes = new aiMesh* [ root->mNumChildren] ();

    std::vector<aiVector3D> vertices;
    std::vector<unsigned int> indices;

    for(const Object& obj : objects) {
        aiNode* nd = *cc++ = new aiNode(obj.name);
        nd->mParent = root;

        // translated from a python dict() - a vector might be sufficient as well
        typedef std::map<unsigned int, unsigned int>  FaceTable;
        FaceTable face_table;

        unsigned int n = 0;
        for(const Edge& edge : obj.edges) {

            face_table[edge.edge[2]] = n;
            face_table[edge.edge[3]] = n;

            ++n;
        }

        aiMesh* mesh = new aiMesh();
        mesh->mNumFaces=static_cast<unsigned int>(face_table.size());
        aiFace* faces = mesh->mFaces = new aiFace[mesh->mNumFaces];

        vertices.clear();
        vertices.reserve(4 * face_table.size()); // arbitrarily chosen
        for(FaceTable::value_type& v : face_table) {
            indices.clear();

            aiFace& f = *faces++;

            const unsigned int key = v.first;
            unsigned int cur_edge = v.second;
            while (1) {
                unsigned int next_edge, next_vert;
                if (key == obj.edges[cur_edge].edge[3]) {
                    next_edge = obj.edges[cur_edge].edge[5];
                    next_vert = obj.edges[cur_edge].edge[1];
                }
                else {
                    next_edge = obj.edges[cur_edge].edge[4];
                    next_vert = obj.edges[cur_edge].edge[0];
                }
                indices.push_back( static_cast<unsigned int>(vertices.size()) );
                vertices.push_back(obj.vertices[ next_vert ].val);

                cur_edge = next_edge;
                if (cur_edge == v.second) {
                    break;
                }
            }

            f.mIndices = new unsigned int[f.mNumIndices = static_cast<unsigned int>(indices.size())];
            std::copy(indices.begin(),indices.end(),f.mIndices);
        }

        mesh->mVertices = new aiVector3D[mesh->mNumVertices = static_cast<unsigned int>(vertices.size())];
        std::copy(vertices.begin(),vertices.end(),mesh->mVertices);

        if (mesh->mNumVertices) {
            pScene->mMeshes[pScene->mNumMeshes] = mesh;

            (nd->mMeshes = new unsigned int[nd->mNumMeshes=1])[0]=pScene->mNumMeshes++;
        }else
            delete mesh;
    }
}